

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O2

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::DoMarkArgsAsVars<mp::SOS_1or2_Constraint<1>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,SOS_1or2_Constraint<1> *con,int param_2)

{
  function<void_(int)> local_30;
  
  std::function<void_(int)>::function(&local_30,(function<void_(int)> *)this);
  VisitArguments<mp::SOS_1or2_Constraint<1>>(con,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return;
}

Assistant:

void DoMarkArgsAsVars(const Con& con, int ) {
    VisitArguments(con, MarkVar_);
  }